

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlog.cxx
# Opt level: O0

void zpsoe::zlog::_print_log(LogLevel_t level,char *file,int line,char *fmt,...)

{
  FILE *pFVar1;
  char in_AL;
  int iVar2;
  undefined8 uVar3;
  char *__format;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_118 [32];
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined4 local_68;
  undefined4 local_64;
  va_list ap_;
  FILE *local_30;
  FILE *log_file_;
  char *fmt_local;
  char *pcStack_18;
  int line_local;
  char *file_local;
  LogLevel_t level_local;
  
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  if ((level != LOG_OFF) && (G_LogConfig <= (int)level)) {
    local_30 = (FILE *)0x0;
    local_f8 = in_R8;
    local_f0 = in_R9;
    log_file_ = (FILE *)fmt;
    fmt_local._4_4_ = line;
    pcStack_18 = file;
    file_local._4_4_ = level;
    if (DAT_001115e4 == 0) {
      open_log_file((FILE **)&local_30);
    }
    else if (DAT_001115e4 == 1) {
      local_30 = _stdout;
    }
    else if (DAT_001115e4 == 2) {
      local_30 = _stderr;
    }
    else {
      local_30 = _stdout;
    }
    if ((_print_log(zpsoe::zlog::LogLevel_t,char_const*,int,char_const*,...)::pid_ == '\0') &&
       (iVar2 = __cxa_guard_acquire(&_print_log(zpsoe::zlog::LogLevel_t,char_const*,int,char_const*,...)
                                     ::pid_), iVar2 != 0)) {
      _print_log::pid_ = getpid();
      __cxa_guard_release(&_print_log(zpsoe::zlog::LogLevel_t,char_const*,int,char_const*,...)::pid_
                         );
    }
    pFVar1 = local_30;
    get_current_date_abi_cxx11_();
    uVar3 = std::__cxx11::string::c_str();
    fprintf(pFVar1,"[%s] [%d] ",uVar3,(ulong)(uint)_print_log::pid_);
    std::__cxx11::string::~string((string *)&ap_[0].reg_save_area);
    if ((int)file_local._4_4_ < 2) {
      fprintf(local_30,"%s:%d ",pcStack_18,(ulong)fmt_local._4_4_);
    }
    ap_[0].overflow_arg_area = local_118;
    ap_[0]._0_8_ = &stack0x00000008;
    local_64 = 0x30;
    local_68 = 0x20;
    vfprintf(local_30,(char *)log_file_,&local_68);
    pFVar1 = local_30;
    __format = (char *)std::__cxx11::string::c_str();
    fprintf(pFVar1,__format);
    fflush(local_30);
    if (DAT_001115e4 == 0) {
      fclose(local_30);
    }
  }
  return;
}

Assistant:

ZPSOE_SHARED_LIB_API void _print_log(
    LogLevel_t level, const char *file, int line, const char *fmt, ...) {
  // 关闭日志
  if (level == LOG_OFF) return;

  // 关闭比用户设置更加详细的日志
  if (level < G_LogConfig.level) return;

  FILE *log_file_ = NULL;

  switch (G_LogConfig.output_to) {
    case LOGOUTPUTSTREAM_STDOUT:
      log_file_ = stdout;
      break;
    case LOGOUTPUTSTREAM_STDERR:
      log_file_ = stderr;
      break;
    case LOGOUTPUTSTREAM_FILE:
      open_log_file(&log_file_);
      break;
    default:
      log_file_ = stdout;
      break;
  }

#ifdef PLATFORM_WIN32
    static int pid_ = _getpid();
#else
    static int pid_ = getpid();
#endif

  fprintf(log_file_, "[%s] [%d] ", get_current_date().c_str(), pid_);

  if (level <= LOG_DEBUG)
    fprintf(log_file_, "%s:%d ", file, line);

  va_list ap_;
  va_start(ap_, fmt);
  vfprintf(log_file_, fmt, ap_);
  va_end(ap_);

  fprintf(log_file_, OS_LINE_FEED.c_str());
  fflush(log_file_);

  if (G_LogConfig.output_to == LOGOUTPUTSTREAM_FILE)
    fclose(log_file_);
}